

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O3

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>::
insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
          (DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
           *this,InterfaceHandle *param_2,ValueFederate **param_3,InterfaceHandle *param_4,
          basic_string_view<char,_std::char_traits<char>_> *param_5,
          basic_string_view<char,_std::char_traits<char>_> *param_6,size_t param_7)

{
  int iVar1;
  DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
  *pDVar2;
  undefined8 uVar3;
  DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
  *pDVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>,_bool> pVar5
  ;
  optional<unsigned_long> oVar6;
  size_t index;
  _Storage<unsigned_long,_true> local_20;
  
  pDVar2 = *(DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
             **)(this + 0xa8);
  if (pDVar2 != (DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                 *)0x0) {
    iVar1 = param_2->hid;
    pDVar4 = this + 0xa0;
    do {
      if (iVar1 <= *(int *)(pDVar2 + 0x20)) {
        pDVar4 = pDVar2;
      }
      pDVar2 = *(DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                 **)(pDVar2 + (ulong)(*(int *)(pDVar2 + 0x20) < iVar1) * 8 + 0x10);
    } while (pDVar2 != (DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>
                        *)0x0);
    if ((pDVar4 != this + 0xa0) && (*(int *)(pDVar4 + 0x20) <= iVar1)) {
      uVar3 = 0;
      local_20._M_value = 0;
      goto LAB_001f9a73;
    }
  }
  local_20 = *(_Storage<unsigned_long,_true> *)this;
  StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>>::
  emplace_back<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>> *)this,
             param_3,param_4,param_5,param_6,
             (basic_string_view<char,_std::char_traits<char>_> *)index);
  pVar5 = std::
          _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,unsigned_long>,std::_Select1st<std::pair<helics::InterfaceHandle_const,unsigned_long>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>>
          ::_M_emplace_unique<helics::InterfaceHandle_const&,unsigned_long&>
                    ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,unsigned_long>,std::_Select1st<std::pair<helics::InterfaceHandle_const,unsigned_long>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,unsigned_long>>>
                      *)(this + 0x98),param_2,&local_20._M_value);
  uVar3 = CONCAT71(pVar5._9_7_,1);
LAB_001f9a73:
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_20._M_value;
  return (optional<unsigned_long>)
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            no_search_type /*searchValue1*/,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup2.find(searchValue2);
            if (fnd != lookup2.end()) {
                return std::nullopt;
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            lookup2.emplace(searchValue2, index);
            return index;
        }